

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::TorsionTypesSectionParser::parseLine
          (TorsionTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  TorsionType *torsionType;
  string at1;
  string torsionConvention;
  string remainder;
  string at4;
  string at3;
  string at2;
  StringTokenizer tokenizer;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  TorsionTypeParser local_130;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  StringTokenizer local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130," ;\t\n\r",(allocator<char> *)&local_150);
  StringTokenizer::StringTokenizer(&local_78,line,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  TorsionTypeParser::TorsionTypeParser(&local_130);
  std::__cxx11::string::string
            ((string *)&local_150,(string *)&(this->options_->TorsionAngleConvention).data_);
  std::locale::locale((locale *)&local_170);
  toUpper<std::__cxx11::string>(&local_150,(locale *)&local_170);
  std::locale::~locale((locale *)&local_170);
  iVar1 = std::__cxx11::string::compare((char *)&local_150);
  local_130.trans180_ = iVar1 == 0;
  iVar1 = StringTokenizer::countTokens(&local_78);
  if (iVar1 < 5) {
    snprintf(painCave.errMsg,2000,"TorsionTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_170,&local_78);
    StringTokenizer::nextToken_abi_cxx11_(&local_98,&local_78);
    StringTokenizer::nextToken_abi_cxx11_(&local_b8,&local_78);
    StringTokenizer::nextToken_abi_cxx11_(&local_d8,&local_78);
    StringTokenizer::getRemainingString_abi_cxx11_(&local_f8,&local_78);
    torsionType = TorsionTypeParser::parseLine(&local_130,&local_f8);
    if (torsionType != (TorsionType *)0x0) {
      ForceField::addTorsionType(ff,&local_170,&local_98,&local_b8,&local_d8,torsionType);
    }
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_170);
  }
  std::__cxx11::string::~string((string *)&local_150);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::TorsionTypeParser::TorsionTypeEnum>_>_>
               *)&local_130);
  StringTokenizer::~StringTokenizer(&local_78);
  return;
}

Assistant:

void TorsionTypesSectionParser::parseLine(ForceField& ff,
                                            const std::string& line,
                                            int lineNo) {
    StringTokenizer tokenizer(line);
    TorsionTypeParser ttParser;
    TorsionType* torsionType = NULL;

    std::string torsionConvention = options_.getTorsionAngleConvention();
    toUpper(torsionConvention);

    if (torsionConvention.compare("180_IS_TRANS") == 0)
      ttParser.Trans180();
    else
      ttParser.Cis180();

    int nTokens = tokenizer.countTokens();

    if (nTokens < 5) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "TorsionTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
      return;
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string at3       = tokenizer.nextToken();
    std::string at4       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();

    try {
      torsionType = ttParser.parseLine(remainder);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "TorsionTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (torsionType != NULL) {
      ff.addTorsionType(at1, at2, at3, at4, torsionType);
    }
  }